

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O1

Image * ImageTextEx(Image *__return_storage_ptr__,Font font,char *text,float fontSize,float spacing,
                   Color tint)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Vector2 VVar5;
  undefined1 auVar6 [16];
  Image src;
  undefined8 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  CharInfo *pCVar10;
  int iVar11;
  int iVar12;
  size_t sVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  float fVar17;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  Rectangle dstRec;
  int codepointByteCount;
  int local_ac;
  Image *local_a8;
  Color local_a0;
  int local_9c;
  size_t local_98;
  char *local_90;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined1 local_78 [16];
  uint local_54;
  
  local_a0 = tint;
  sVar13 = strlen(text);
  local_90 = text;
  VVar5 = MeasureTextEx(font,text,(float)font.baseSize,spacing);
  local_88 = VVar5.y;
  local_78._8_4_ = extraout_XMM0_Dc;
  local_78._0_4_ = VVar5.x;
  local_78._4_4_ = VVar5.y;
  local_78._12_4_ = extraout_XMM0_Dd;
  iVar15 = 0;
  local_a8 = __return_storage_ptr__;
  fStack_84 = local_88;
  fStack_80 = local_88;
  fStack_7c = local_88;
  GenImageColor(__return_storage_ptr__,(int)VVar5.x,(int)local_88,(Color)0x0);
  local_98 = sVar13;
  if (0 < (int)sVar13) {
    local_9c = (int)spacing;
    iVar14 = 0;
    iVar16 = 0;
    do {
      local_ac = 0;
      iVar11 = GetNextCodepoint(local_90 + iVar16,&local_ac);
      iVar12 = GetGlyphIndex(font,iVar11);
      if (iVar11 < 0x20) {
        if (iVar11 == 9) goto LAB_00140033;
        if (iVar11 != 10) goto LAB_0013ffc3;
        iVar14 = iVar14 + font.baseSize + font.baseSize / 2;
        iVar15 = 0;
      }
      else {
        if (iVar11 != 0x20) {
          if (iVar11 == 0x3f) {
            local_ac = 1;
          }
LAB_0013ffc3:
          dstRec.x = (float)(font.chars[iVar12].offsetX + iVar15);
          uVar1 = font.recs[iVar12].width;
          uVar2 = font.recs[iVar12].height;
          dstRec.height = (float)uVar2;
          dstRec.width = (float)uVar1;
          uVar3 = font.chars[iVar12].image.mipmaps;
          uVar4 = font.chars[iVar12].image.format;
          src.format = uVar4;
          src.mipmaps = uVar3;
          pCVar10 = font.chars + iVar12;
          uVar7 = (pCVar10->image).data;
          uVar8 = (pCVar10->image).width;
          uVar9 = (pCVar10->image).height;
          src.height = uVar9;
          src.width = uVar8;
          src.data = (void *)uVar7;
          auVar6._4_4_ = (float)font.chars[iVar12].image.height;
          auVar6._0_4_ = (float)font.chars[iVar12].image.width;
          auVar6._8_8_ = 0;
          dstRec.y = (float)(font.chars[iVar12].offsetY + iVar14);
          ImageDraw(local_a8,src,(Rectangle)(auVar6 << 0x40),dstRec,local_a0);
        }
LAB_00140033:
        iVar11 = font.chars[iVar12].advanceX;
        if (iVar11 == 0) {
          iVar11 = (int)(font.recs[iVar12].width + spacing);
        }
        else {
          iVar15 = iVar15 + local_9c;
        }
        iVar15 = iVar15 + iVar11;
      }
      iVar16 = iVar16 + local_ac;
    } while (iVar16 < (int)local_98);
  }
  if (local_88 < fontSize) {
    fVar17 = fontSize / local_88;
    TraceLog(3,"IMAGE: Text scaled by factor: %f",SUB84((double)fVar17,0));
    GetFontDefault();
    if (font.texture.id == local_54) {
      ImageResizeNN(local_a8,(int)((float)local_78._0_4_ * fVar17),(int)(fVar17 * local_88));
    }
    else {
      ImageResize(local_a8,(int)((float)local_78._0_4_ * fVar17),(int)(fVar17 * local_88));
    }
  }
  return local_a8;
}

Assistant:

Image ImageTextEx(Font font, const char *text, float fontSize, float spacing, Color tint)
{
    int length = (int)strlen(text);

    int textOffsetX = 0;            // Image drawing position X
    int textOffsetY = 0;            // Offset between lines (on line break '\n')

    // NOTE: Text image is generated at font base size, later scaled to desired font size
    Vector2 imSize = MeasureTextEx(font, text, (float)font.baseSize, spacing);

    // Create image to store text
    Image imText = GenImageColor((int)imSize.x, (int)imSize.y, BLANK);

    for (int i = 0; i < length; i++)
    {
        // Get next codepoint from byte string and glyph index in font
        int codepointByteCount = 0;
        int codepoint = GetNextCodepoint(&text[i], &codepointByteCount);
        int index = GetGlyphIndex(font, codepoint);

        // NOTE: Normally we exit the decoding sequence as soon as a bad byte is found (and return 0x3f)
        // but we need to draw all of the bad bytes using the '?' symbol moving one byte
        if (codepoint == 0x3f) codepointByteCount = 1;

        if (codepoint == '\n')
        {
            // NOTE: Fixed line spacing of 1.5 line-height
            // TODO: Support custom line spacing defined by user
            textOffsetY += (font.baseSize + font.baseSize/2);
            textOffsetX = 0;
        }
        else
        {
            if ((codepoint != ' ') && (codepoint != '\t'))
            {
                Rectangle rec = { (float)(textOffsetX + font.chars[index].offsetX), (float)(textOffsetY + font.chars[index].offsetY), (float)font.recs[index].width, (float)font.recs[index].height };
                ImageDraw(&imText, font.chars[index].image, (Rectangle){ 0, 0, (float)font.chars[index].image.width, (float)font.chars[index].image.height }, rec, tint);
            }

            if (font.chars[index].advanceX == 0) textOffsetX += (int)(font.recs[index].width + spacing);
            else textOffsetX += font.chars[index].advanceX + (int)spacing;
        }

        i += (codepointByteCount - 1);   // Move text bytes counter to next codepoint
    }

    // Scale image depending on text size
    if (fontSize > imSize.y)
    {
        float scaleFactor = fontSize/imSize.y;
        TRACELOG(LOG_INFO, "IMAGE: Text scaled by factor: %f", scaleFactor);

        // Using nearest-neighbor scaling algorithm for default font
        if (font.texture.id == GetFontDefault().texture.id) ImageResizeNN(&imText, (int)(imSize.x*scaleFactor), (int)(imSize.y*scaleFactor));
        else ImageResize(&imText, (int)(imSize.x*scaleFactor), (int)(imSize.y*scaleFactor));
    }

    return imText;
}